

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O1

vec3_t project_to_plane(plane_t p,vec3_t pt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  vec3_t vVar7;
  
  fVar5 = pt.z;
  uVar4 = pt._0_8_;
  fVar1 = p.a;
  fVar2 = p.b;
  fVar3 = p.c;
  fVar6 = -(fVar3 * fVar5 + fVar1 * pt.x + fVar2 * pt.y + p.d) /
          ((-fVar1 * fVar1 - fVar2 * fVar2) - fVar3 * fVar3);
  if (0.0 <= fVar6) {
    uVar4 = CONCAT44(pt.y - fVar2 * fVar6,pt.x - fVar1 * fVar6);
    fVar5 = fVar5 - fVar3 * fVar6;
  }
  vVar7.z = fVar5;
  vVar7.x = (float)(int)uVar4;
  vVar7.y = (float)(int)((ulong)uVar4 >> 0x20);
  return vVar7;
}

Assistant:

vec3_t
project_to_plane(plane_t p, vec3_t pt) {
    vec3_t  invN    = vec3_mulf(plane_normal(p), -1.0f);
    ray3_t  ray     = ray3_from(pt, invN);
    vec3_t  out     = pt;
    plane_ray3_intersection(p, ray, &out);
    return out;
}